

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

bool __thiscall
bssl::Vector<NotDefaultConstructible>::Push
          (Vector<NotDefaultConstructible> *this,NotDefaultConstructible *elem)

{
  undefined8 *puVar1;
  NotDefaultConstructible *pNVar2;
  size_t sVar3;
  NotDefaultConstructible *pNVar4;
  undefined8 *puVar5;
  int line;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  uVar6 = this->capacity_;
  bVar8 = true;
  if (this->size_ < uVar6) goto LAB_00328544;
  if (uVar6 == 0) {
    uVar6 = 0x10;
LAB_00328459:
    if (uVar6 >> 0x3c == 0) {
      pNVar4 = (NotDefaultConstructible *)OPENSSL_malloc(uVar6 << 4);
      bVar8 = pNVar4 != (NotDefaultConstructible *)0x0;
      if (bVar8) {
        sVar3 = this->size_;
        if (sVar3 != 0) {
          pNVar2 = this->data_;
          lVar7 = 0;
          do {
            puVar1 = (undefined8 *)((long)&(pNVar4->array).data_ + lVar7);
            *puVar1 = 0;
            puVar1[1] = 0;
            OPENSSL_free((void *)0x0);
            puVar1 = (undefined8 *)((long)&(pNVar4->array).data_ + lVar7);
            puVar5 = (undefined8 *)((long)&(pNVar2->array).data_ + lVar7);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined8 *)((long)&(pNVar4->array).data_ + lVar7) = *puVar5;
            *(undefined8 *)((long)&(pNVar4->array).size_ + lVar7) = puVar5[1];
            *puVar5 = 0;
            puVar5[1] = 0;
            lVar7 = lVar7 + 0x10;
          } while ((NotDefaultConstructible *)(puVar5 + 2) != pNVar2 + sVar3);
        }
        clear(this);
        this->data_ = pNVar4;
        this->size_ = sVar3;
        this->capacity_ = uVar6;
        bVar8 = true;
      }
      goto LAB_00328544;
    }
    line = 0x153;
  }
  else {
    if (-1 < (long)uVar6) {
      uVar6 = uVar6 * 2;
      goto LAB_00328459;
    }
    line = 0x14d;
  }
  bVar8 = false;
  ERR_put_error(0xe,0,0x45,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_internal.h"
                ,line);
LAB_00328544:
  if (bVar8 != false) {
    pNVar4 = this->data_;
    sVar3 = this->size_;
    pNVar4[sVar3].array.data_ = (int *)0x0;
    pNVar4[sVar3].array.size_ = 0;
    OPENSSL_free((void *)0x0);
    pNVar4[sVar3].array.data_ = (int *)0x0;
    pNVar4[sVar3].array.size_ = 0;
    pNVar4[sVar3].array.data_ = (elem->array).data_;
    pNVar4[sVar3].array.size_ = (elem->array).size_;
    (elem->array).data_ = (int *)0x0;
    (elem->array).size_ = 0;
    this->size_ = this->size_ + 1;
  }
  return bVar8;
}

Assistant:

[[nodiscard]] bool Push(T elem) {
    if (!MaybeGrow()) {
      return false;
    }
    new (&data_[size_]) T(std::move(elem));
    size_++;
    return true;
  }